

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Clear
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  ChunkHeader *ptr;
  ChunkHeader *c;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  if (this->shared_->refcount == 0) {
    __assert_fail("shared_->refcount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/allocators.h"
                  ,0x116,
                  "void rapidjson::MemoryPoolAllocator<>::Clear() [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  while (ptr = this->shared_->chunkHead, ptr->next != (ChunkHeader *)0x0) {
    this->shared_->chunkHead = ptr->next;
    CrtAllocator::Free(ptr);
  }
  this->shared_->chunkHead->size = 0;
  return;
}

Assistant:

void Clear() RAPIDJSON_NOEXCEPT {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        for (;;) {
            ChunkHeader* c = shared_->chunkHead;
            if (!c->next) {
                break;
            }
            shared_->chunkHead = c->next;
            baseAllocator_->Free(c);
        }
        shared_->chunkHead->size = 0;
    }